

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataFlowAnalysis.cpp
# Opt level: O0

void __thiscall
slang::analysis::DataFlowAnalysis::handle(DataFlowAnalysis *this,AssignmentExpression *expr)

{
  bool bVar1;
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState> *in_RSI;
  Expression *in_RDI;
  DataFlowAnalysis *unaff_retaddr;
  Expression *timing;
  
  *(undefined1 *)&in_RDI[0x3d].constant = 1;
  timing = in_RDI;
  slang::ast::AssignmentExpression::left((AssignmentExpression *)in_RSI);
  AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
  visit<slang::ast::Expression>(in_RSI,in_RDI);
  *(undefined1 *)&in_RDI[0x3d].constant = 0;
  bVar1 = slang::ast::AssignmentExpression::isLValueArg((AssignmentExpression *)unaff_retaddr);
  if (!bVar1) {
    slang::ast::AssignmentExpression::right((AssignmentExpression *)in_RSI);
    AbstractFlowAnalysis<slang::analysis::DataFlowAnalysis,_slang::analysis::DataFlowState>::
    visit<slang::ast::Expression>(in_RSI,in_RDI);
  }
  if ((in_RSI->super_FlowAnalysisBase).evalContext.astCtx.instanceOrProc != (Symbol *)0x0) {
    handleTiming(unaff_retaddr,(TimingControl *)timing);
  }
  return;
}

Assistant:

void DataFlowAnalysis::handle(const AssignmentExpression& expr) {
    // Note that this method mirrors the logic in the base class
    // handler but we need to track the LValue status of the lhs.
    SLANG_ASSERT(!isLValue);
    isLValue = true;
    visit(expr.left());
    isLValue = false;

    if (!expr.isLValueArg())
        visit(expr.right());

    if (expr.timingControl)
        handleTiming(*expr.timingControl);
}